

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV2CameraSettingsBlock(Parser *this,Camera *camera)

{
  bool bVar1;
  int local_1c;
  int iDepth;
  Camera *camera_local;
  Parser *this_local;
  
  local_1c = 0;
  do {
    while (*this->filePtr != '*') {
LAB_0062f22b:
      if (*this->filePtr == '{') {
        local_1c = local_1c + 1;
      }
      else if (*this->filePtr == '}') {
        local_1c = local_1c + -1;
        if (local_1c == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a CAMERA_SETTINGS chunk (Level 2)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_NEAR",0xb);
    if (bVar1) {
      ParseLV4MeshFloat(this,&camera->mNear);
    }
    else {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_FAR",10);
      if (bVar1) {
        ParseLV4MeshFloat(this,&camera->mFar);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_FOV",10);
        if (!bVar1) goto LAB_0062f22b;
        ParseLV4MeshFloat(this,(ai_real *)&(camera->super_BaseNode).field_0x154);
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV2CameraSettingsBlock(ASE::Camera& camera)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"CAMERA_NEAR" ,11))
            {
                ParseLV4MeshFloat(camera.mNear);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FAR" ,10))
            {
                ParseLV4MeshFloat(camera.mFar);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FOV" ,10))
            {
                ParseLV4MeshFloat(camera.mFOV);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","CAMERA_SETTINGS");
    }
    return;
}